

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O1

void Imf_3_4::precalculateTileInfo
               (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int **numXTiles,
               int **numYTiles,int *numXLevels,int *numYLevels)

{
  LevelMode LVar1;
  LevelRoundingMode LVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ArgExc *this;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  LVar1 = tileDesc->mode;
  iVar5 = 1;
  iVar7 = 1;
  if (LVar1 != ONE_LEVEL) {
    if (LVar1 == RIPMAP_LEVELS) {
      iVar7 = (maxX - minX) + 1;
    }
    else {
      if (LVar1 != MIPMAP_LEVELS) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this,"Unknown LevelMode format.");
        goto LAB_001a73b3;
      }
      iVar4 = (maxX - minX) + 1;
      iVar7 = (maxY - minY) + 1;
      if (iVar7 < iVar4) {
        iVar7 = iVar4;
      }
    }
    iVar7 = anon_unknown_15::roundLog2(iVar7,tileDesc->roundingMode);
    iVar7 = iVar7 + 1;
  }
  *numXLevels = iVar7;
  if (LVar1 != ONE_LEVEL) {
    if (LVar1 == RIPMAP_LEVELS) {
      iVar7 = (maxY - minY) + 1;
    }
    else {
      if (LVar1 != MIPMAP_LEVELS) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this,"Unknown LevelMode format.");
LAB_001a73b3:
        __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      iVar5 = (maxX - minX) + 1;
      iVar7 = (maxY - minY) + 1;
      if (iVar7 < iVar5) {
        iVar7 = iVar5;
      }
    }
    iVar5 = anon_unknown_15::roundLog2(iVar7,tileDesc->roundingMode);
    iVar5 = iVar5 + 1;
  }
  *numYLevels = iVar5;
  lVar9 = (long)*numXLevels;
  uVar8 = lVar9 * 4;
  if (lVar9 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar8);
  *numXTiles = piVar6;
  uVar8 = (long)iVar5 * 4;
  if (iVar5 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar8);
  *numYTiles = piVar6;
  if (0 < lVar9) {
    piVar6 = *numXTiles;
    LVar2 = tileDesc->roundingMode;
    uVar3 = tileDesc->xSize;
    lVar10 = 0;
    do {
      iVar7 = levelSize(minX,maxX,(int)lVar10,LVar2);
      piVar6[lVar10] = (int)(((long)iVar7 + ((long)(int)uVar3 - 1U)) / (ulong)(long)(int)uVar3);
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  iVar7 = *numYLevels;
  if (0 < (long)iVar7) {
    piVar6 = *numYTiles;
    LVar2 = tileDesc->roundingMode;
    uVar3 = tileDesc->ySize;
    lVar9 = 0;
    do {
      iVar5 = levelSize(minY,maxY,(int)lVar9,LVar2);
      piVar6[lVar9] = (int)(((long)iVar5 + ((long)(int)uVar3 - 1U)) / (ulong)(long)(int)uVar3);
      lVar9 = lVar9 + 1;
    } while (iVar7 != lVar9);
  }
  return;
}

Assistant:

void
precalculateTileInfo (
    const TileDescription& tileDesc,
    int                    minX,
    int                    maxX,
    int                    minY,
    int                    maxY,
    int*&                  numXTiles,
    int*&                  numYTiles,
    int&                   numXLevels,
    int&                   numYLevels)
{
    numXLevels = calculateNumXLevels (tileDesc, minX, maxX, minY, maxY);
    numYLevels = calculateNumYLevels (tileDesc, minX, maxX, minY, maxY);

    numXTiles = new int[numXLevels];
    numYTiles = new int[numYLevels];

    calculateNumTiles (
        numXTiles,
        numXLevels,
        minX,
        maxX,
        tileDesc.xSize,
        tileDesc.roundingMode);

    calculateNumTiles (
        numYTiles,
        numYLevels,
        minY,
        maxY,
        tileDesc.ySize,
        tileDesc.roundingMode);
}